

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

uint my_rational_to_uint(my_rational *a,uint scale,uint *remainder)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  wchar_t wVar4;
  long lVar5;
  size_t sVar6;
  ushort *puVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  uint16_t qr_u16n [2];
  uint16_t d_u16n [2];
  uint16_t r2_u16n [2];
  uint16_t r_u16n [2];
  uint16_t rr_u16n [4];
  uint16_t p_u16n [4];
  uint16_t w_u16n [3];
  
  if (scale == 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = a->d;
    uVar8 = (ulong)a->n / (ulong)uVar13;
    uVar1 = (ulong)a->n % (ulong)uVar13;
    if ((int)(scale * uVar8 >> 0x20) == 0) {
      uVar2 = (ulong)scale % (ulong)uVar13;
      uVar12 = (int)uVar8 * scale;
      iVar11 = (int)uVar1;
      uVar9 = (scale / uVar13) * iVar11;
      uVar10 = uVar9 + uVar12;
      if (!CARRY4(uVar9,uVar12)) {
        if ((iVar11 == 0) || ((int)(uVar1 * uVar2 >> 0x20) == 0)) {
          uVar9 = (int)uVar2 * iVar11;
          uVar12 = uVar9 / uVar13;
          uVar14 = uVar12 + uVar10;
          if (!CARRY4(uVar12,uVar10)) {
            if (remainder == (uint *)0x0) {
              return uVar14;
            }
            *remainder = uVar9 % uVar13;
            return uVar14;
          }
        }
        else {
          lVar5 = 1;
          do {
            uVar8 = uVar1;
            r_u16n[lVar5] = (uint16_t)uVar8;
            bVar15 = lVar5 != 0;
            lVar5 = lVar5 + -1;
            uVar1 = uVar8 >> 0x10;
          } while (bVar15);
          if (0xffff < (uint)uVar8) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6e5,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          lVar5 = 1;
          do {
            uVar8 = uVar2;
            r2_u16n[lVar5] = (uint16_t)uVar8;
            bVar15 = lVar5 != 0;
            lVar5 = lVar5 + -1;
            uVar2 = uVar8 >> 0x10;
          } while (bVar15);
          if (0xffff < (uint)uVar8) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6e9,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          lVar5 = 1;
          do {
            uVar9 = uVar13;
            d_u16n[lVar5] = (uint16_t)uVar9;
            bVar15 = lVar5 != 0;
            lVar5 = lVar5 + -1;
            uVar13 = uVar9 >> 0x10;
          } while (bVar15);
          if (0xffff < uVar9) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6ed,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          _Var3 = mul_u16n(p_u16n,r_u16n,r2_u16n,4,2,2);
          if (_Var3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6f2,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          wVar4 = div_u16n(qr_u16n,rr_u16n,w_u16n,p_u16n,d_u16n,2,4,2);
          if (wVar4 != L'\0') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6f7,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          sVar6 = msb_u16n(qr_u16n,2);
          if (0x20 < sVar6) {
            __assert_fail("msb_u16n(qr_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6fa,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          puVar7 = qr_u16n + 1;
          uVar13 = 0;
          lVar5 = 0;
          do {
            uVar13 = uVar13 + ((uint)*puVar7 << ((byte)lVar5 & 0x1f));
            puVar7 = puVar7 + -1;
            bVar15 = lVar5 != 0x10;
            lVar5 = lVar5 + 0x10;
          } while (bVar15);
          if (!CARRY4(uVar13,uVar10)) {
            if (remainder == (uint *)0x0) {
              return uVar13 + uVar10;
            }
            sVar6 = msb_u16n(rr_u16n,4);
            if (sVar6 < 0x21) {
              lVar5 = 0;
              puVar7 = rr_u16n + 3;
              uVar9 = 0;
              do {
                uVar9 = uVar9 + ((uint)*puVar7 << ((byte)lVar5 & 0x1f));
                lVar5 = lVar5 + 0x10;
                puVar7 = puVar7 + -1;
              } while (lVar5 != 0x20);
              *remainder = uVar9;
              if (uVar9 < a->d) {
                return uVar13 + uVar10;
              }
              __assert_fail("*remainder < a->d",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                            ,0x702,
                            "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                           );
            }
            __assert_fail("msb_u16n(rr_u16n, 2 * MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x700,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
        }
      }
    }
    uVar13 = 0xffffffff;
  }
  if (remainder != (uint *)0x0) {
    *remainder = 0;
  }
  return uVar13;
}

Assistant:

unsigned int my_rational_to_uint(const struct my_rational *a,
		unsigned int scale, unsigned int *remainder)
{
	unsigned int result, r, q, r2, t;

	if (!scale) {
		if (remainder) {
			*remainder = 0;
		}
		return 0;
	}
	result = a->n / a->d;
	if (result > UINT_MAX / scale) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result *= scale;
	r = a->n % a->d;
	q = scale / a->d;
	if (result > UINT_MAX - q * r) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result += q * r;
	r2 = scale - q * a->d;
	if (r && r2 > UINT_MAX / r) {
		/*
		 * The product of the remainders overflows in the native
		 * arithmetic so use multiprecision integers.
		 */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t r_u16n[MP_DIGITS], r2_u16n[MP_DIGITS];
		uint16_t d_u16n[MP_DIGITS], p_u16n[2 * MP_DIGITS];
		uint16_t qr_u16n[MP_DIGITS], rr_u16n[2 * MP_DIGITS];
		uint16_t w_u16n[MP_DIGITS + 1];
		bool over;

		over = ini_u16n(r_u16n, MP_DIGITS, r);
		if (over) {
			assert(0);
		}
		over = ini_u16n(r2_u16n, MP_DIGITS, r2);
		if (over) {
			assert(0);
		}
		over = ini_u16n(d_u16n, MP_DIGITS, a->d);
		if (over) {
			assert(0);
		}
		over = mul_u16n(p_u16n, r_u16n, r2_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(qr_u16n, rr_u16n, w_u16n, p_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS, MP_DIGITS) != 0);
		if (over) {
			assert(0);
		}
		assert(msb_u16n(qr_u16n, MP_DIGITS)
			<= sizeof(unsigned int) * CHAR_BIT);
		q = ext_u16n(qr_u16n, MP_DIGITS);
		if (result <= UINT_MAX - q) {
			result += q;
			if (remainder) {
				assert(msb_u16n(rr_u16n, 2 * MP_DIGITS)
					<= sizeof(unsigned int) * CHAR_BIT);
				*remainder = ext_u16n(rr_u16n, 2 * MP_DIGITS);
				assert(*remainder < a->d);
			}
		} else {
			result = UINT_MAX;
			if (remainder) {
				*remainder = 0;
			}
		}
		return result;
#undef MP_DIGITS
	}
	t = r * r2;
	q = t / a->d;
	if (result > UINT_MAX - q) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result += q;
	if (remainder) {
		*remainder = t - q * a->d;
	}
	return result;
}